

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O3

char * test_matrix4_set_from_quaternion_zx_quarter_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  quaternion *qT;
  char *pcVar3;
  vector3 r;
  quaternion q;
  matrix4 m;
  vector3 local_6c;
  quaternion local_60;
  matrix4 local_50;
  
  pvVar2 = vector3_get_reference_vector3(3);
  qT = quaternion_set_from_axis_anglev3(&local_60,pvVar2,1.5707964);
  matrix4_make_transformation_rotationq(&local_50,qT);
  pvVar2 = vector3_get_reference_vector3(1);
  pvVar2 = vector3_set(&local_6c,pvVar2);
  vector3_multiplym4(pvVar2,&local_50);
  pvVar2 = vector3_get_reference_vector3(5);
  iVar1 = vector3_equals(&local_6c,pvVar2);
  pcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(473) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(5))))"
    ;
  }
  return pcVar3;
}

Assistant:

static char *test_matrix4_set_from_quaternion_zx_quarter_turn(void)
{
	struct matrix4 m;
	struct quaternion q;
	struct vector3 r;

	matrix4_make_transformation_rotationq(&m, quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_Z, HYP_TAU / 4.0f));
	vector3_multiplym4(vector3_set(&r, HYP_VECTOR3_UNIT_X), &m);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Y_NEGATIVE));

	return NULL;
}